

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_node_effects.cpp
# Opt level: O0

void __thiscall
PixelR8G8B8A8_GradApply<fe::PixelA8>::getPixel
          (PixelR8G8B8A8_GradApply<fe::PixelA8> *this,uchar *data,Pixel *p,int x,int y)

{
  ImageData *this_00;
  uchar *data_00;
  fe_image *im;
  int local_48;
  int gx;
  float dist;
  fe_image *image;
  fe_plane *plane;
  Pixel g;
  PixelR8G8B8A8 gp;
  int y_local;
  int x_local;
  Pixel *p_local;
  uchar *data_local;
  PixelR8G8B8A8_GradApply<fe::PixelA8> *this_local;
  
  g.field_0 = (anon_union_4_3_3c41bd51_for_Pixel_0)y;
  fe::PixelA8::getPixel((PixelA8 *)this,data,p,x,y);
  im = &(this->grad).image;
  local_48 = (int)((((float)x * (this->grad).plane.a + (float)(int)g.field_0 * (this->grad).plane.b)
                   - (this->grad).plane.d) + this->d);
  if (im->w <= local_48) {
    local_48 = im->w + -1;
  }
  if (local_48 < 0) {
    local_48 = 0;
  }
  this_00 = asImage(im);
  data_00 = fe::ImageData::getPixelPtr(this_00,local_48,0);
  fe::PixelR8G8B8A8::getPixel
            ((PixelR8G8B8A8 *)((long)&plane + 7),data_00,(Pixel *)&plane,x,(int)g.field_0);
  (p->field_0).field_0.bytes[0] = (uchar)plane;
  (p->field_0).field_0.bytes[1] = plane._1_1_;
  (p->field_0).field_0.bytes[2] = plane._2_1_;
  (p->field_0).field_0.bytes[3] =
       (uchar)((ulong)((uint)(p->field_0).field_0.bytes[3] * (uint)plane._3_1_) / 0xff);
  return;
}

Assistant:

void getPixel(GET_PIXEL_ARGS) const
    {
        T::getPixel(GET_PIXEL_ARGS_PASS);

        PixelR8G8B8A8 gp;
        Pixel g;

        const fe_plane& plane = grad.plane;
        const fe_image& image = grad.image;

        float dist = x * plane.a + y * plane.b - plane.d + d;

        int gx = int(dist);
        if (gx >= image.w)
            gx = image.w - 1;
        if (gx < 0)
            gx = 0;

        gp.getPixel(asImage(&image)->getPixelPtr(gx, 0), g, OPERATOR_ARGS_PASS);

        p.r = g.r;
        p.g = g.g;
        p.b = g.b;
        p.a = (p.a * g.a) / 255;
    }